

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O3

XrResult GenValidUsageInputsXrSetInputDeviceStateBoolEXT
                   (XrSession session,XrPath topLevelPath,XrPath inputSourcePath,XrBool32 state)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  ValidateXrHandleResult VVar3;
  char *pcVar4;
  long lVar5;
  XrResult XVar6;
  string out;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  ostringstream oss;
  string local_230;
  XrSession local_210;
  string local_208;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1e8;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1c8;
  string local_1b0;
  XrObjectType local_190 [28];
  ios_base local_120 [264];
  
  local_1e8.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_190[0] = XR_OBJECT_TYPE_SESSION;
  local_210 = session;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrSession_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)
             &local_1e8,&local_210,local_190);
  VVar3 = VerifyXrSessionHandle(&local_210);
  if (VVar3 == VALIDATE_XR_HANDLE_SUCCESS) {
    XVar6 = XR_SUCCESS;
    HandleInfo<XrSession_T_*>::getWithInstanceInfo(&g_session_info,local_210);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"Invalid XrSession handle \"session\" ",0x23);
    local_208._M_dataplus._M_p = (pointer)local_210;
    paVar1 = &local_230.field_2;
    local_230._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_230,'\x12');
    *local_230._M_dataplus._M_p = '0';
    local_230._M_dataplus._M_p[1] = 'x';
    pcVar4 = local_230._M_dataplus._M_p + (local_230._M_string_length - 1);
    lVar5 = 0;
    do {
      bVar2 = *(byte *)((long)&local_208._M_dataplus._M_p + lVar5);
      *pcVar4 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 & 0xf];
      pcVar4[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 >> 4];
      lVar5 = lVar5 + 1;
      pcVar4 = pcVar4 + -2;
    } while (lVar5 != 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,local_230._M_dataplus._M_p,local_230._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar1) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    local_230._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_230,"VUID-xrSetInputDeviceStateBoolEXT-session-parameter","");
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_208,"xrSetInputDeviceStateBoolEXT","");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_1c8,&local_1e8);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,&local_230,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_208,&local_1c8,&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    if (local_1c8.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1c8.
                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1c8.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1c8.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar1) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
    std::ios_base::~ios_base(local_120);
    XVar6 = XR_ERROR_HANDLE_INVALID;
  }
  if (local_1e8.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.
                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e8.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return XVar6;
}

Assistant:

XrResult GenValidUsageInputsXrSetInputDeviceStateBoolEXT(
XrSession session,
XrPath topLevelPath,
XrPath inputSourcePath,
XrBool32 state) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(session, XR_OBJECT_TYPE_SESSION);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrSessionHandle(&session);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrSession handle \"session\" ";
                oss << HandleToHexString(session);
                CoreValidLogMessage(nullptr, "VUID-xrSetInputDeviceStateBoolEXT-session-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrSetInputDeviceStateBoolEXT",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_session_info.getWithInstanceInfo(session);
        GenValidUsageXrHandleInfo *gen_session_info = info_with_instance.first;
        (void)gen_session_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}